

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O2

bool __thiscall Snake::SnakeCell(Snake *this,int x,int y)

{
  int *piVar1;
  bool bVar2;
  int *piVar3;
  
  if (((int)*(float *)(this + 0x10) != x) || (bVar2 = true, (int)*(float *)(this + 0x14) != y)) {
    piVar1 = *(int **)(this + 0x18);
    do {
      piVar3 = piVar1;
      bVar2 = piVar3 != *(int **)(this + 0x20);
      if (piVar3 == *(int **)(this + 0x20)) {
        return bVar2;
      }
      piVar1 = piVar3 + 2;
    } while ((*piVar3 != x) || (piVar3[1] != y));
  }
  return bVar2;
}

Assistant:

bool Snake::SnakeCell(int x, int y) {
  if (x == static_cast<int>(head_x) && y == static_cast<int>(head_y)) {
    return true;
  }
  for (auto const &item : body) {
    if (x == item.x && y == item.y) {
      return true;
    }
  }
  return false;
}